

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMXPathExpressionImpl.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::DOMXPathExpressionImpl::testNode
          (DOMXPathExpressionImpl *this,XPathMatcher *matcher,DOMXPathResultImpl *result,
          DOMElement *node)

{
  XMLStringPool *pXVar1;
  DOMXPathResultImpl *result_00;
  DOMNode *node_00;
  XPathMatcher *this_00;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uriId;
  uint uriId_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLSize_t XVar5;
  undefined4 extraout_var_02;
  XMLSize_t XVar6;
  long *plVar7;
  XMLAttr *this_01;
  undefined8 uVar8;
  XMLCh *rawName;
  XMLCh *attrValue;
  undefined4 extraout_var_03;
  DOMElement *node_01;
  undefined4 extraout_var_05;
  BaseRefVectorOf<xercesc_4_0::XMLAttr> local_150;
  DOMXPathResultImpl *local_120;
  DOMNode *local_118;
  XPathMatcher *local_110;
  MemoryManager *local_108;
  long *local_100;
  QName qName;
  SchemaElementDecl elemDecl;
  undefined4 extraout_var_04;
  
  pXVar1 = this->fStringPool;
  iVar4 = (*(node->super_DOMNode)._vptr_DOMNode[0x16])(node);
  uriId = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])
                    (pXVar1,CONCAT44(extraout_var,iVar4));
  iVar4 = (*(node->super_DOMNode)._vptr_DOMNode[2])(node);
  QName::QName(&qName,(XMLCh *)CONCAT44(extraout_var_00,iVar4),uriId,this->fMemoryManager);
  SchemaElementDecl::SchemaElementDecl
            (&elemDecl,&qName,Any,0xfffffffe,XMLPlatformUtils::fgMemoryManager);
  iVar4 = (*(node->super_DOMNode)._vptr_DOMNode[0xb])(node);
  local_100 = (long *)CONCAT44(extraout_var_01,iVar4);
  XVar5 = (**(code **)(*local_100 + 0x28))();
  local_150.fMemoryManager = this->fMemoryManager;
  local_150.fAdoptedElems = true;
  local_150.fCurCount = 0;
  local_150.fMaxCount = XVar5;
  local_120 = result;
  local_118 = &node->super_DOMNode;
  local_110 = matcher;
  iVar4 = (*(local_150.fMemoryManager)->_vptr_MemoryManager[3])(local_150.fMemoryManager,XVar5 * 8);
  local_150.fElemList = (XMLAttr **)CONCAT44(extraout_var_02,iVar4);
  if (XVar5 == 0) {
    local_150._vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00406678;
  }
  else {
    XVar6 = 0;
    do {
      local_150.fElemList[XVar6] = (XMLAttr *)0x0;
      XVar6 = XVar6 + 1;
    } while (XVar5 != XVar6);
    local_150._vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00406678;
    XVar6 = 0;
    do {
      plVar7 = (long *)(**(code **)(*local_100 + 0x18))(local_100,XVar6);
      local_108 = this->fMemoryManager;
      this_01 = (XMLAttr *)XMemory::operator_new(0x28,local_108);
      pXVar1 = this->fStringPool;
      uVar8 = (**(code **)(*plVar7 + 0xb0))(plVar7);
      uriId_00 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,uVar8);
      rawName = (XMLCh *)(**(code **)(*plVar7 + 0x10))(plVar7);
      attrValue = (XMLCh *)(**(code **)(*plVar7 + 0x18))(plVar7);
      bVar2 = (bool)(**(code **)(*plVar7 + 0x148))(plVar7);
      XMLAttr::XMLAttr(this_01,uriId_00,rawName,attrValue,AttTypes_Min,bVar2,this->fMemoryManager,
                       (DatatypeValidator *)0x0,true);
      BaseRefVectorOf<xercesc_4_0::XMLAttr>::ensureExtraCapacity(&local_150,1);
      local_150.fElemList[local_150.fCurCount] = this_01;
      local_150.fCurCount = local_150.fCurCount + 1;
      XVar6 = XVar6 + 1;
    } while (XVar5 != XVar6);
  }
  node_00 = local_118;
  iVar4 = (*local_118->_vptr_DOMNode[0x17])(local_118);
  this_00 = local_110;
  (*local_110->_vptr_XPathMatcher[4])
            (local_110,&elemDecl,(ulong)uriId,CONCAT44(extraout_var_03,iVar4),&local_150,XVar5,0);
  bVar3 = XPathMatcher::isMatched(this_00);
  result_00 = local_120;
  if ((bVar3 == 0) || (bVar3 == 0xd)) {
LAB_00283c60:
    iVar4 = (*node_00->_vptr_DOMNode[7])(node_00);
    node_01 = (DOMElement *)CONCAT44(extraout_var_04,iVar4);
    while (node_01 != (DOMElement *)0x0) {
      iVar4 = (*(node_01->super_DOMNode)._vptr_DOMNode[4])(node_01);
      if ((iVar4 == 1) && (bVar2 = testNode(this,this_00,result_00,node_01), bVar2)) {
        bVar2 = true;
        goto LAB_00283cf8;
      }
      iVar4 = (*(node_01->super_DOMNode)._vptr_DOMNode[10])(node_01);
      node_01 = (DOMElement *)CONCAT44(extraout_var_05,iVar4);
    }
  }
  else {
    DOMXPathResultImpl::addResult(local_120,node_00);
    iVar4 = (*(result_00->super_DOMXPathResult)._vptr_DOMXPathResult[2])(result_00);
    bVar2 = true;
    if ((iVar4 == 8) ||
       (iVar4 = (*(result_00->super_DOMXPathResult)._vptr_DOMXPathResult[2])(result_00), iVar4 == 9)
       ) goto LAB_00283cf8;
    if ((bVar3 | 8) == 0xd) goto LAB_00283c60;
  }
  bVar2 = false;
  (*this_00->_vptr_XPathMatcher[5])(this_00,&elemDecl,&XMLUni::fgZeroLenString,0,0);
LAB_00283cf8:
  RefVectorOf<xercesc_4_0::XMLAttr>::~RefVectorOf((RefVectorOf<xercesc_4_0::XMLAttr> *)&local_150);
  SchemaElementDecl::~SchemaElementDecl(&elemDecl);
  QName::~QName(&qName);
  return bVar2;
}

Assistant:

bool DOMXPathExpressionImpl::testNode(XPathMatcher* matcher, DOMXPathResultImpl* result, DOMElement *node) const
{
    int uriId=fStringPool->addOrFind(node->getNamespaceURI());
    QName qName(node->getNodeName(), uriId, fMemoryManager);
    SchemaElementDecl elemDecl(&qName);
    DOMNamedNodeMap* attrMap=node->getAttributes();
    XMLSize_t attrCount = attrMap->getLength();
    RefVectorOf<XMLAttr> attrList(attrCount, true, fMemoryManager);
    for(XMLSize_t i=0;i<attrCount;i++)
    {
        DOMAttr* attr=(DOMAttr*)attrMap->item(i);
        attrList.addElement(new (fMemoryManager) XMLAttr(fStringPool->addOrFind(attr->getNamespaceURI()),
                                                         attr->getNodeName(),
                                                         attr->getNodeValue(),
                                                         XMLAttDef::CData,
                                                         attr->getSpecified(),
                                                         fMemoryManager,
                                                         NULL,
                                                         true));
    }
    matcher->startElement(elemDecl, uriId, node->getPrefix(), attrList, attrCount);
    unsigned char nMatch=matcher->isMatched();
    if(nMatch!=0 && nMatch!=XPathMatcher::XP_MATCHED_DP)
    {
        result->addResult(node);
        if(result->getResultType()==DOMXPathResult::ANY_UNORDERED_NODE_TYPE || result->getResultType()==DOMXPathResult::FIRST_ORDERED_NODE_TYPE)
            return true;    // abort navigation, we found one result
    }

    if(nMatch==0 || nMatch==XPathMatcher::XP_MATCHED_D || nMatch==XPathMatcher::XP_MATCHED_DP)
    {
        DOMNode* child=node->getFirstChild();
        while(child)
        {
            if(child->getNodeType()==DOMNode::ELEMENT_NODE)
                if(testNode(matcher, result, (DOMElement*)child))
                    return true;
            child=child->getNextSibling();
        }
    }
    matcher->endElement(elemDecl, XMLUni::fgZeroLenString);
    return false;
}